

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O2

void __thiscall OPL_DOSBOXdump::~OPL_DOSBOXdump(OPL_DOSBOXdump *this)

{
  FILE *__stream;
  long lVar1;
  DWORD len [2];
  
  (this->super_OPLDump).super_OPLEmul._vptr_OPLEmul = (_func_int **)&PTR__OPL_DOSBOXdump_006e9b70;
  __stream = (FILE *)(this->super_OPLDump).File;
  if (__stream != (FILE *)0x0) {
    lVar1 = ftell(__stream);
    fseek((FILE *)(this->super_OPLDump).File,0xc,0);
    len[1] = (int)lVar1 - 0x18;
    len[0] = (this->super_OPLDump).CurIntTime;
    fwrite(len,4,2,(FILE *)(this->super_OPLDump).File);
    fclose((FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual ~OPL_DOSBOXdump()
	{
		if (File != NULL)
		{
			long where_am_i = ftell(File);
			DWORD len[2];

			fseek(File, 12, SEEK_SET);
			len[0] = LittleLong(CurIntTime);
			len[1] = LittleLong(DWORD(where_am_i - 24));
			fwrite(len, 4, 2, File);
			fclose(File);
		}
	}